

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O0

configuration configuration_create(char *scope,char *path,char *parent,void *allocator)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  configuration config;
  char *in_stack_ffffffffffffffb0;
  configuration in_stack_ffffffffffffffb8;
  char *path_00;
  char *name;
  configuration local_8;
  
  local_8 = configuration_singleton_get(in_stack_ffffffffffffffb0);
  if (local_8 == (configuration)0x0) {
    path_00 = in_RDI;
    name = in_RSI;
    configuration_scope((char *)in_stack_ffffffffffffffb8);
    local_8 = configuration_object_initialize(name,path_00,in_stack_ffffffffffffffb8);
    if (local_8 == (configuration)0x0) {
      log_write_impl_va("metacall",0x91,"configuration_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration.c"
                        ,3,"Invalid configuration (%s) scope map creation [%s]",in_RDI,in_RSI);
      local_8 = (configuration)0x0;
    }
    else {
      iVar1 = configuration_impl_load((configuration)parent,allocator);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x98,"configuration_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration.c"
                          ,3,"Invalid configuration implementation load <%p>",local_8);
        configuration_object_destroy((configuration)0x10294c);
        local_8 = (configuration)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

configuration configuration_create(const char *scope, const char *path, const char *parent, void *allocator)
{
	configuration config = configuration_singleton_get(scope);

	if (config != NULL)
	{
		return config;
	}

	config = configuration_object_initialize(scope, path, configuration_scope(parent));

	if (config == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration (%s) scope map creation [%s]", scope, path);

		return NULL;
	}

	if (configuration_impl_load(config, allocator) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration implementation load <%p>", config);

		configuration_object_destroy(config);

		return NULL;
	}

	return config;
}